

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xvxsigdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 c2;
  TCGv_i64 c2_00;
  TCGv_i64 exp;
  TCGv_i64 nan;
  TCGv_i64 zr;
  TCGv_i64 t0;
  TCGv_i64 xbl;
  TCGv_i64 xbh;
  TCGv_i64 xtl;
  TCGv_i64 xth;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    dst = tcg_temp_new_i64(tcg_ctx_00);
    dst_00 = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst,uVar1);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrl(tcg_ctx_00,dst_00,uVar1);
    ret_01 = tcg_temp_new_i64(tcg_ctx_00);
    ret_02 = tcg_temp_new_i64(tcg_ctx_00);
    c2 = tcg_const_i64_ppc64(tcg_ctx_00,0);
    c2_00 = tcg_const_i64_ppc64(tcg_ctx_00,0x7ff);
    tcg_gen_extract_i64_ppc64(tcg_ctx_00,ret_01,dst,0x34,0xb);
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,ret_02,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_02,ret_01,c2,c2,ret_02);
    tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_02,ret_01,c2_00,c2,ret_02);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret,ret_02,dst,0,0x34);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrh(tcg_ctx_00,uVar1,ret);
    tcg_gen_extract_i64_ppc64(tcg_ctx_00,ret_01,dst_00,0x34,0xb);
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,ret_02,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_02,ret_01,c2,c2,ret_02);
    tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_02,ret_01,c2_00,c2,ret_02);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret_00,ret_02,dst_00,0,0x34);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrl(tcg_ctx_00,uVar1,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,ret_02);
    tcg_temp_free_i64(tcg_ctx_00,ret_01);
    tcg_temp_free_i64(tcg_ctx_00,c2);
    tcg_temp_free_i64(tcg_ctx_00,c2_00);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,dst);
    tcg_temp_free_i64(tcg_ctx_00,dst_00);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xvxsigdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;
    TCGv_i64 t0, zr, nan, exp;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));
    exp = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    zr = tcg_const_i64(tcg_ctx, 0);
    nan = tcg_const_i64(tcg_ctx, 2047);

    tcg_gen_extract_i64(tcg_ctx, exp, xbh, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    tcg_gen_deposit_i64(tcg_ctx, xth, t0, xbh, 0, 52);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);

    tcg_gen_extract_i64(tcg_ctx, exp, xbl, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    tcg_gen_deposit_i64(tcg_ctx, xtl, t0, xbl, 0, 52);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, exp);
    tcg_temp_free_i64(tcg_ctx, zr);
    tcg_temp_free_i64(tcg_ctx, nan);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}